

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void decode_opc_special(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  uint uVar1;
  uintptr_t o;
  TCGv_i32 pTVar2;
  ulong uVar3;
  uint rt;
  uint rd;
  int excp;
  uint *ctx_00;
  TCGContext_conflict6 *tcg_ctx;
  uint rs;
  uint32_t opc;
  uint stype;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  uVar1 = ctx->opcode;
  opc = uVar1 & 0xfc00003f;
  ctx_00 = (uint *)ctx;
  if (0x3f < opc) {
switchD_009999f1_caseD_1:
    if (((uint)ctx->insn_flags >> 0xd & 1) == 0) {
      if ((ctx->insn_flags >> 0x33 & 1) == 0) {
        decode_opc_special_legacy(env,ctx);
        return;
      }
      decode_opc_special_tx79((CPUMIPSState_conflict8 *)ctx,(DisasContext_conflict6 *)ctx_00);
      return;
    }
    goto LAB_00999d2f;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  rs = uVar1 >> 0x15 & 0x1f;
  rt = uVar1 >> 0x10 & 0x1f;
  rd = uVar1 >> 0xb & 0x1f;
  stype = uVar1 >> 6 & 0x1f;
  ctx_00 = &switchD_009999f1::switchdataD_00d9f524;
  switch(opc) {
  case 0:
    if ((((stype == 5) && (((uVar1 >> 0xb | uVar1 >> 0x15 | uVar1 >> 0x10) & 0x1f) == 0)) &&
        ((ctx->insn_flags & 0x2000) != 0)) && ((ctx->hflags & 0x87f800) != 0)) goto LAB_00999ce7;
  case 3:
LAB_00999c89:
    gen_shift_imm((DisasContext_conflict6 *)tcg_ctx,opc,rd,rt,(int16_t)stype);
    return;
  default:
    goto switchD_009999f1_caseD_1;
  case 2:
    if (rs == 0) {
      opc = 2;
      goto LAB_00999c89;
    }
    if (rs == 1) {
      opc = (uint)(((byte)ctx->insn_flags & 0x40) >> 6) << 0x15 | 2;
      goto LAB_00999c89;
    }
    goto LAB_00999ce7;
  case 4:
  case 7:
    break;
  case 5:
    if (((ctx->insn_flags & 0x2000) == 0) && ((env->CP0_Config3 & 0x10000000) == 0)) {
      pTVar2 = tcg_const_i32_mips64el(tcg_ctx,stype);
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      tcg_gen_callN_mips64el(tcg_ctx,helper_pmon_mips64el,(TCGTemp *)0x0,2,&local_48);
      tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
      return;
    }
    goto LAB_00999d2f;
  case 6:
    if (stype == 0) {
      opc = 6;
      break;
    }
    if (stype == 1) {
      opc = (byte)ctx->insn_flags & 0x40 | 6;
      break;
    }
LAB_00999ce7:
    excp = 0x14;
LAB_00999cef:
    generate_exception_err(ctx,excp,0);
    return;
  case 9:
    gen_compute_branch(ctx,9,4,rs,rd,stype,4);
    return;
  case 0xc:
    excp = 0x11;
    goto LAB_00999cef;
  case 0xd:
    excp = 0x12;
    goto LAB_00999cef;
  case 0xf:
    if ((ctx->insn_flags & 2) == 0) {
      generate_exception_err(ctx,0x14,0);
      stype = ctx->opcode >> 6 & 0x1f;
    }
    gen_sync(tcg_ctx,stype);
    return;
  case 0x14:
  case 0x17:
    if ((ctx->insn_flags & 4) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    if ((ctx->hflags & 8) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    tcg_ctx = ctx->uc->tcg_ctx;
    break;
  case 0x15:
    if (((ctx->insn_flags & 0x2000) == 0) && ((env->CP0_Config3 & 0x10000000) == 0)) {
      return;
    }
LAB_00999d2f:
    decode_opc_special_r6((CPUMIPSState_conflict8 *)ctx,(DisasContext_conflict6 *)ctx_00);
    return;
  case 0x16:
    if (stype == 1) {
      uVar3 = ctx->insn_flags;
      opc = (uint)uVar3 & 0x40 | 0x16;
    }
    else {
      if (stype != 0) goto LAB_00999ce7;
      uVar3 = ctx->insn_flags;
      opc = 0x16;
    }
    if ((uVar3 & 4) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    if ((ctx->hflags & 8) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    tcg_ctx = ctx->uc->tcg_ctx;
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
    goto switchD_009999f1_caseD_20;
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    gen_logic((DisasContext_conflict6 *)tcg_ctx,opc,rd,rs,rt);
    return;
  case 0x2a:
  case 0x2b:
    gen_slt((DisasContext_conflict6 *)tcg_ctx,opc,rd,rs,rt);
    return;
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    if ((ctx->insn_flags & 4) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    if ((ctx->hflags & 8) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    goto switchD_009999f1_caseD_20;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x36:
    if ((ctx->insn_flags & 2) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    gen_trap(ctx,opc,rs,rt,-1);
    return;
  case 0x38:
  case 0x3b:
  case 0x3c:
  case 0x3f:
    if ((ctx->insn_flags & 4) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    if ((ctx->hflags & 8) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    tcg_ctx = ctx->uc->tcg_ctx;
    goto LAB_00999c89;
  case 0x3a:
    if (rs == 1) {
      uVar3 = ctx->insn_flags;
      opc = ((uint)uVar3 & 0x40) << 0xf | 0x3a;
    }
    else {
      if (rs != 0) goto LAB_00999ce7;
      uVar3 = ctx->insn_flags;
      opc = 0x3a;
    }
    goto LAB_00999d6d;
  case 0x3e:
    if (rs == 1) {
      uVar3 = ctx->insn_flags;
      opc = ((uint)uVar3 & 0x40) << 0xf | 0x3e;
    }
    else {
      if (rs != 0) goto LAB_00999ce7;
      uVar3 = ctx->insn_flags;
      opc = 0x3e;
    }
LAB_00999d6d:
    if ((uVar3 & 4) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    if ((ctx->hflags & 8) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    tcg_ctx = ctx->uc->tcg_ctx;
    goto LAB_00999c89;
  }
  gen_shift((DisasContext_conflict6 *)tcg_ctx,opc,rd,rs,rt);
  return;
switchD_009999f1_caseD_20:
  gen_arith(ctx,opc,rd,rs,rt);
  return;
}

Assistant:

static void decode_opc_special(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs, rt, rd, sa;
    uint32_t op1;

    rs = (ctx->opcode >> 21) & 0x1f;
    rt = (ctx->opcode >> 16) & 0x1f;
    rd = (ctx->opcode >> 11) & 0x1f;
    sa = (ctx->opcode >> 6) & 0x1f;

    op1 = MASK_SPECIAL(ctx->opcode);
    switch (op1) {
    case OPC_SLL:          /* Shift with immediate */
        if (sa == 5 && rd == 0 &&
            rs == 0 && rt == 0) { /* PAUSE */
            if ((ctx->insn_flags & ISA_MIPS32R6) &&
                (ctx->hflags & MIPS_HFLAG_BMASK)) {
                generate_exception_end(ctx, EXCP_RI);
                break;
            }
        }
        /* Fallthrough */
    case OPC_SRA:
        gen_shift_imm(ctx, op1, rd, rt, sa);
        break;
    case OPC_SRL:
        switch ((ctx->opcode >> 21) & 0x1f) {
        case 1:
            /* rotr is decoded as srl on non-R2 CPUs */
            if (ctx->insn_flags & ISA_MIPS32R2) {
                op1 = OPC_ROTR;
            }
            /* Fallthrough */
        case 0:
            gen_shift_imm(ctx, op1, rd, rt, sa);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_ADD:
    case OPC_ADDU:
    case OPC_SUB:
    case OPC_SUBU:
        gen_arith(ctx, op1, rd, rs, rt);
        break;
    case OPC_SLLV:         /* Shifts */
    case OPC_SRAV:
        gen_shift(ctx, op1, rd, rs, rt);
        break;
    case OPC_SRLV:
        switch ((ctx->opcode >> 6) & 0x1f) {
        case 1:
            /* rotrv is decoded as srlv on non-R2 CPUs */
            if (ctx->insn_flags & ISA_MIPS32R2) {
                op1 = OPC_ROTRV;
            }
            /* Fallthrough */
        case 0:
            gen_shift(ctx, op1, rd, rs, rt);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_SLT:          /* Set on less than */
    case OPC_SLTU:
        gen_slt(ctx, op1, rd, rs, rt);
        break;
    case OPC_AND:          /* Logic*/
    case OPC_OR:
    case OPC_NOR:
    case OPC_XOR:
        gen_logic(ctx, op1, rd, rs, rt);
        break;
    case OPC_JALR:
        gen_compute_branch(ctx, op1, 4, rs, rd, sa, 4);
        break;
    case OPC_TGE: /* Traps */
    case OPC_TGEU:
    case OPC_TLT:
    case OPC_TLTU:
    case OPC_TEQ:
    case OPC_TNE:
        check_insn(ctx, ISA_MIPS2);
        gen_trap(ctx, op1, rs, rt, -1);
        break;
    case OPC_LSA: /* OPC_PMON */
        if ((ctx->insn_flags & ISA_MIPS32R6) ||
            (env->CP0_Config3 & (1 << CP0C3_MSAP))) {
            decode_opc_special_r6(env, ctx);
        } else {
            /* Pmon entry point, also R4010 selsl */
#ifdef MIPS_STRICT_STANDARD
            MIPS_INVAL("PMON / selsl");
            generate_exception_end(ctx, EXCP_RI);
#else
            gen_helper_0e0i(pmon, sa);
#endif
        }
        break;
    case OPC_SYSCALL:
        generate_exception_end(ctx, EXCP_SYSCALL);
        break;
    case OPC_BREAK:
        generate_exception_end(ctx, EXCP_BREAK);
        break;
    case OPC_SYNC:
        check_insn(ctx, ISA_MIPS2);
        gen_sync(tcg_ctx, extract32(ctx->opcode, 6, 5));
        break;

#if defined(TARGET_MIPS64)
        /* MIPS64 specific opcodes */
    case OPC_DSLL:
    case OPC_DSRA:
    case OPC_DSLL32:
    case OPC_DSRA32:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        gen_shift_imm(ctx, op1, rd, rt, sa);
        break;
    case OPC_DSRL:
        switch ((ctx->opcode >> 21) & 0x1f) {
        case 1:
            /* drotr is decoded as dsrl on non-R2 CPUs */
            if (ctx->insn_flags & ISA_MIPS32R2) {
                op1 = OPC_DROTR;
            }
            /* Fallthrough */
        case 0:
            check_insn(ctx, ISA_MIPS3);
            check_mips_64(ctx);
            gen_shift_imm(ctx, op1, rd, rt, sa);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_DSRL32:
        switch ((ctx->opcode >> 21) & 0x1f) {
        case 1:
            /* drotr32 is decoded as dsrl32 on non-R2 CPUs */
            if (ctx->insn_flags & ISA_MIPS32R2) {
                op1 = OPC_DROTR32;
            }
            /* Fallthrough */
        case 0:
            check_insn(ctx, ISA_MIPS3);
            check_mips_64(ctx);
            gen_shift_imm(ctx, op1, rd, rt, sa);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_DADD:
    case OPC_DADDU:
    case OPC_DSUB:
    case OPC_DSUBU:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        gen_arith(ctx, op1, rd, rs, rt);
        break;
    case OPC_DSLLV:
    case OPC_DSRAV:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        gen_shift(ctx, op1, rd, rs, rt);
        break;
    case OPC_DSRLV:
        switch ((ctx->opcode >> 6) & 0x1f) {
        case 1:
            /* drotrv is decoded as dsrlv on non-R2 CPUs */
            if (ctx->insn_flags & ISA_MIPS32R2) {
                op1 = OPC_DROTRV;
            }
            /* Fallthrough */
        case 0:
            check_insn(ctx, ISA_MIPS3);
            check_mips_64(ctx);
            gen_shift(ctx, op1, rd, rs, rt);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_DLSA:
        if ((ctx->insn_flags & ISA_MIPS32R6) ||
            (env->CP0_Config3 & (1 << CP0C3_MSAP))) {
            decode_opc_special_r6(env, ctx);
        }
        break;
#endif
    default:
        if (ctx->insn_flags & ISA_MIPS32R6) {
            decode_opc_special_r6(env, ctx);
        } else if (ctx->insn_flags & INSN_R5900) {
            decode_opc_special_tx79(env, ctx);
        } else {
            decode_opc_special_legacy(env, ctx);
        }
    }
}